

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O1

void __thiscall
modified_public_keycase::_impl<picnic_params_t>
          (modified_public_keycase *this,anon_enum_32 *parameters)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  context_frame context_frame_1980;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  size_t signature_len;
  picnic_publickey_t pk;
  picnic_privatekey_t sk;
  context_frame local_214;
  size_type local_210;
  assertion_result local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  size_type local_1c8;
  value_expr<int> local_1bc;
  assertion_result local_1b8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_188;
  assertion_result local_180;
  char *local_168;
  const_string local_138;
  char *local_128;
  char *local_120;
  const_string local_118;
  const_string local_108;
  const_string local_f8;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  lazy_ostream local_98;
  undefined ***local_88;
  undefined1 *local_80;
  
  local_180.m_message.px._0_1_ = 0;
  local_180._0_8_ = &PTR__lazy_ostream_00184600;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168 = "Parameter set: ";
  local_1a0._0_8_ = picnic_get_param_name(*parameters);
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00186760;
  local_88 = (undefined ***)&local_180;
  local_80 = local_1a0;
  boost::test_tools::tt_detail::context_frame::context_frame(&local_214,&local_98);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_214);
  if (bVar2) {
    local_210 = picnic_signature_size(*parameters);
    local_a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_a8.m_end = "";
    local_b8.m_begin = "";
    local_b8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,200,&local_b8);
    local_208._0_8_ = &local_210;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              (&local_180,(value_expr<const_unsigned_long_&> *)&local_208,false);
    local_1a0._0_8_ = "max_signature_size";
    local_1a0._8_8_ = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001867a0;
    local_88 = (undefined ***)boost::unit_test::lazy_ostream::inst;
    local_c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_c8.m_end = "";
    local_80 = local_1a0;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,&local_98,&local_c8,200,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
    local_d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_d8.m_end = "";
    local_e8.m_begin = "";
    local_e8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0xcc,&local_e8);
    iVar3 = picnic_keygen(*parameters,&local_180,&local_98);
    local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_208,(value_expr<bool> *)&local_1b8,false);
    local_188 = &local_1e8;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!picnic_keygen(parameters, &pk, &sk)";
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
    local_1a0._0_8_ = &PTR__lazy_ostream_001867a0;
    local_190 = boost::unit_test::lazy_ostream::inst;
    local_f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_f8.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_208,(lazy_ostream *)local_1a0,&local_f8,0xcc,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
    local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_208._0_8_ = (unsigned_long *)0x0;
    local_208.m_message.px = (element_type *)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,local_210);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1e8,0x200);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_1e8);
    lVar5 = -1;
    do {
      lVar4 = picnic_get_private_key_size(*parameters);
      pbVar1 = (byte *)((long)&local_98._vptr_lazy_ostream + lVar5 + lVar4);
      *pbVar1 = ~*pbVar1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != -0xf);
    local_1c8 = local_210;
    local_108.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_108.m_end = "";
    local_118.m_begin = "";
    local_118.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0xdb,&local_118);
    local_1bc.m_value =
         picnic_sign(&local_98,
                     local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,0x200,local_208._0_8_,&local_1c8);
    boost::test_tools::assertion::value_expr<int>::evaluate(&local_1b8,&local_1bc,false);
    local_188 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128;
    local_128 = "picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)";
    local_120 = "";
    local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
    local_1a0._0_8_ = &PTR__lazy_ostream_001867a0;
    local_190 = boost::unit_test::lazy_ostream::inst;
    local_138.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_138.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_1b8,(lazy_ostream *)local_1a0,&local_138,0xdb,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
    if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((unsigned_long *)local_208._0_8_ != (unsigned_long *)0x0) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&local_214);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_public_key, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    for (size_t offset = 1; offset != 15; ++offset) {
      sk.data[picnic_get_private_key_size(parameters) - offset] ^= 0xff;
    }

    size_t signature_len = max_signature_size;
    BOOST_TEST(picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
  }
}